

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManRandomTest1(void)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  
  __stream = fopen("rand.txt","w");
  iVar2 = 1;
  do {
    uVar1 = Aig_ManRandom(0);
    fprintf(__stream,"%10d : %10d ",iVar2,(ulong)uVar1);
    fputc(10,__stream);
    if (iVar2 == 20000) break;
    iVar2 = iVar2 + 1;
  } while (uVar1 != 1);
  fclose(__stream);
  return;
}

Assistant:

void Aig_ManRandomTest1()
{
    FILE * pFile;
    unsigned int lfsr;
    unsigned int period = 0; 
    pFile = fopen( "rand.txt", "w" );
    do {
        lfsr = Aig_ManRandom( 0 );
        ++period;
        fprintf( pFile, "%10d : %10d ", period, lfsr );
//        Extra_PrintBinary( pFile, &lfsr, 32 );
        fprintf( pFile, "\n" );
        if ( period == 20000 )
            break;
    } while(lfsr != 1u);
    fclose( pFile );
}